

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactor<double>::solveLleftForest
          (CLUFactor<double> *this,double *vec,int *param_2,double param_3)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  iVar2 = (this->l).firstUpdate;
  iVar3 = (this->l).firstUnused;
  if (iVar2 < iVar3) {
    pdVar5 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->l).idx;
    piVar7 = (this->l).row;
    piVar8 = (this->l).start;
    lVar10 = (long)iVar3;
    do {
      lVar9 = lVar10 + -1;
      dVar1 = vec[piVar7[lVar10 + -1]];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar3 = piVar8[lVar9];
        iVar11 = piVar8[lVar10];
        if (iVar3 < iVar11) {
          lVar10 = (long)iVar3 * 4;
          do {
            iVar4 = *(int *)((long)piVar6 + lVar10);
            vec[iVar4] = vec[iVar4] - *(double *)((long)pdVar5 + lVar10 * 2) * dVar1;
            iVar11 = iVar11 + -1;
            lVar10 = lVar10 + 4;
          } while (iVar3 < iVar11);
        }
      }
      lVar10 = lVar9;
    } while (iVar2 < lVar9);
  }
  return 0;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R* vec, int* /* nonz */, R /* eps */)
{
   int i, j, k, end;
   R x;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
            vec[*idx++] -= x * (*val++);
      }
   }

   return 0;
}